

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O1

void __thiscall ast::Section::write_block(Section *this,uint offset,uint8_t *data,uint size)

{
  uint new_capacity;
  uint uVar1;
  
  new_capacity = size + offset;
  uVar1 = this->content_capacity;
  while (uVar1 < new_capacity) {
    enlarge(this,new_capacity);
    uVar1 = this->content_capacity;
  }
  memcpy(this->content + offset,data,(ulong)size);
  if (this->content_size < new_capacity) {
    this->content_size = new_capacity;
  }
  return;
}

Assistant:

void Section::write_block(unsigned offset, const uint8_t *data, unsigned size)
{
	auto limit_superior = offset + size;
	while (limit_superior > content_capacity)
		enlarge(limit_superior);
	memcpy(content + offset, data, size);
	if (limit_superior > content_size)
		content_size += limit_superior - content_size;
}